

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O2

size_t xemmai::anon_unknown_18::f_expand(void ***a_pc,t_pvalue *a_stack,size_t a_n)

{
  t_object *a_object;
  bool bVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar2;
  long lVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  void ***pppvVar6;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  size_t n;
  undefined1 local_98 [24];
  t_value<xemmai::t_pointer> size;
  t_pointer local_58;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aStack_50;
  t_color local_40;
  bool bStack_3f;
  undefined6 uStack_3e;
  ulong local_38;
  
  if (a_stack == (t_pvalue *)0x0) {
    __assert_fail("a_n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/code.cc"
                  ,0x1a,
                  "size_t xemmai::(anonymous namespace)::f_expand(void **&, t_pvalue *, size_t)");
  }
  pppvVar6 = a_pc + (long)a_stack * 2 + 2;
  a_object = (t_object *)*pppvVar6;
  local_58.v_p = (t_object *)*pppvVar6;
  aStack_50 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
               (a_pc + (long)a_stack * 2 + 3);
  bVar1 = t_type_of<xemmai::t_object>::t_cast<xemmai::t_tuple>::f_is(a_object);
  if (bVar1) {
    uVar5 = *(ulong *)a_object->v_data;
    if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar6 + uVar5 * 2) {
      *(void ****)(in_FS_OFFSET + -0x30) = pppvVar6 + uVar5 * 2;
    }
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      *(undefined8 *)((long)a_pc + lVar3 + (long)a_stack * 0x10 + 0x10) =
           *(undefined8 *)(a_object->v_data + lVar3 + 8);
      *(undefined8 *)((long)a_pc + lVar3 + (long)a_stack * 0x10 + 0x18) =
           *(undefined8 *)(a_object->v_data + lVar3 + 0x10);
      lVar3 = lVar3 + 0x10;
    }
  }
  else {
    bVar1 = t_type_of<xemmai::t_object>::t_cast<xemmai::t_list>::f_is(a_object);
    if (bVar1) {
      size.field_0.v_integer = (intptr_t)a_object->v_data;
      size.super_t_pointer.v_p = (t_object *)&n;
      if (*(long *)a_object->v_data == *(long *)(in_FS_OFFSET + -0x68)) {
        f_expand::anon_class_24_3_351435c3::operator()((anon_class_24_3_351435c3 *)&size);
        uVar5 = n;
      }
      else {
        if (*(long *)a_object->v_data != 0) {
          a_message._M_str = L"owned by another thread.";
          a_message._M_len = 0x18;
          f_throw(a_message);
        }
        local_98._0_8_ = a_object->v_data + 8;
        local_98[8] = true;
        std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)local_98._0_8_);
        if (*(long *)a_object->v_data != 0) {
          a_message_00._M_str = L"owned by another thread.";
          a_message_00._M_len = 0x18;
          f_throw(a_message_00);
        }
        f_expand::anon_class_24_3_351435c3::operator()((anon_class_24_3_351435c3 *)&size);
        std::shared_lock<std::shared_mutex>::~shared_lock
                  ((shared_lock<std::shared_mutex> *)local_98);
        uVar5 = n;
      }
    }
    else {
      t_value<xemmai::t_pointer>::f_invoke<>
                (&size,(t_object *)&stack0xffffffffffffffa8,
                 *(size_t **)(*(long *)(in_FS_OFFSET + -0x78) + 0x2e0));
      f_check<unsigned_long>(size.super_t_pointer.v_p,L"size");
      paVar2 = &size.field_0;
      if ((t_object *)0x4 < size.super_t_pointer.v_p) {
        paVar2 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
                 (size.super_t_pointer.v_p)->v_data;
      }
      uVar5 = paVar2->v_integer;
      if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar6 + uVar5 * 2) {
        *(void ****)(in_FS_OFFSET + -0x30) = pppvVar6 + uVar5 * 2;
      }
      n = uVar5;
      for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        local_40 = c_color__WHITING;
        bStack_3f = false;
        uStack_3e = 0;
        local_38 = uVar4;
        t_value<xemmai::t_pointer>::f_get_at
                  ((t_value<xemmai::t_pointer> *)local_98,(t_pvalue *)&stack0xffffffffffffffa8);
        *pppvVar6 = (void **)local_98._0_8_;
        pppvVar6[1] = (void **)CONCAT71(local_98._9_7_,local_98[8]);
        pppvVar6 = pppvVar6 + 2;
      }
    }
  }
  return (long)a_stack + (uVar5 - 1);
}

Assistant:

size_t f_expand(void**& a_pc, t_pvalue* a_stack, size_t a_n)
{
	assert(a_n > 0);
	a_stack += a_n + 1;
	auto x = a_stack[0];
	size_t n;
	if (f_is<t_tuple>(x)) {
		auto& tuple = x->f_as<t_tuple>();
		n = tuple.f_size();
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = tuple[i];
	} else if (f_is<t_list>(x)) {
		auto& list = x->f_as<t_list>();
		list.f_owned_or_shared<std::shared_lock>([&]
		{
			n = list.f_size();
			f_allocate(a_stack, n);
			for (size_t i = 0; i < n; ++i) a_stack[i] = list[i];
		});
	} else {
		static size_t index;
		auto size = x.f_invoke(f_global()->f_symbol_size(), index);
		f_check<size_t>(size, L"size");
		n = f_as<size_t>(size);
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = x.f_get_at(i);
	}
	return a_n - 1 + n;
}